

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_stream_reader.cpp
# Opt level: O1

void __thiscall charls::jpeg_stream_reader::read_start_of_frame_segment(jpeg_stream_reader *this)

{
  byte bVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  int iVar4;
  
  if ((this->segment_data_).size_ < 6) {
LAB_00124177:
    read_start_of_frame_segment();
LAB_0012417c:
    read_start_of_frame_segment();
LAB_00124181:
    read_start_of_frame_segment();
LAB_00124186:
    read_start_of_frame_segment();
  }
  else {
    bVar1 = read_byte(this);
    (this->frame_info_).bits_per_sample = (uint)bVar1;
    if ((byte)(bVar1 - 0x11) < 0xf1) goto LAB_0012417c;
    uVar3 = read_uint16(this);
    if (uVar3 == 0) {
LAB_001240e7:
      uVar3 = read_uint16(this);
      if (uVar3 != 0) {
        if ((this->frame_info_).width != 0) goto LAB_00124190;
        (this->frame_info_).width = (uint)uVar3;
      }
      bVar1 = read_byte(this);
      (this->frame_info_).component_count = (uint)bVar1;
      if (bVar1 == 0) goto LAB_00124181;
      if ((this->segment_data_).size_ == (ulong)bVar1 * 3 + 6) {
        if ((this->frame_info_).component_count != 0) {
          iVar4 = 0;
          do {
            uVar2 = read_byte(this);
            add_component(this,uVar2);
            uVar2 = read_byte(this);
            if (uVar2 != '\x11') {
              read_start_of_frame_segment();
              goto LAB_00124177;
            }
            if (this->end_position_ < this->position_ + 1) goto LAB_00124195;
            this->position_ = this->position_ + 1;
            iVar4 = iVar4 + 1;
          } while (iVar4 != (this->frame_info_).component_count);
        }
        this->state_ = scan_section;
        return;
      }
      goto LAB_00124186;
    }
    if ((this->frame_info_).height == 0) {
      (this->frame_info_).height = (uint)uVar3;
      goto LAB_001240e7;
    }
  }
  read_start_of_frame_segment();
LAB_00124190:
  read_start_of_frame_segment();
LAB_00124195:
  __assert_fail("position_ + count <= end_position_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/jpeg_stream_reader.h"
                ,0x4b,"void charls::jpeg_stream_reader::advance_position(const size_t)");
}

Assistant:

void jpeg_stream_reader::check_minimal_segment_size(const size_t minimum_size) const
{
    if (UNLIKELY(minimum_size > segment_data_.size()))
        throw_jpegls_error(jpegls_errc::invalid_marker_segment_size);
}